

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::analysis::ClockVisitor::SeqExprVisitor&>
          (MinTypMaxExpression *this,SeqExprVisitor *visitor)

{
  Expression::visit<slang::analysis::ClockVisitor::SeqExprVisitor&>(this->min_,visitor);
  Expression::visit<slang::analysis::ClockVisitor::SeqExprVisitor&>(this->typ_,visitor);
  Expression::visit<slang::analysis::ClockVisitor::SeqExprVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }